

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

Aig_Man_t * Aig_ManRemap(Aig_Man_t *p,Vec_Ptr_t *vMap)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  long *plVar7;
  Aig_Obj_t *pAVar8;
  undefined8 *puVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  int iVar11;
  int iVar12;
  Vec_Ptr_t *p_01;
  int iVar13;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  iVar11 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar11;
  p_00->nBarBufs = p->nBarBufs;
  pVVar4 = p->vFlopNums;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->nSize != p->nRegs) {
      pcVar3 = "p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs";
      uVar2 = 0x3a;
      goto LAB_0057feb8;
    }
    pVVar4 = Vec_IntDup(pVVar4);
    p_00->vFlopNums = pVVar4;
  }
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vFlopReprs);
    p_00->vFlopReprs = pVVar4;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  iVar11 = 0;
  while( true ) {
    p_01 = p->vCis;
    iVar1 = p_01->nSize;
    if (iVar1 <= iVar11) break;
    pvVar5 = Vec_PtrEntry(p_01,iVar11);
    pAVar6 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar6;
    iVar11 = iVar11 + 1;
  }
  iVar11 = p->nObjs[2] - p->nRegs;
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    for (iVar13 = 0; iVar12 = iVar11 + iVar13, iVar12 < iVar1; iVar13 = iVar13 + 1) {
      plVar7 = (long *)Vec_PtrEntry(p_01,iVar12);
      iVar1 = Vec_IntEntry(p->vFlopNums,iVar13);
      *plVar7 = (long)iVar1;
      p_01 = p->vCis;
      iVar1 = p_01->nSize;
    }
  }
  for (iVar1 = 0; iVar13 = p_01->nSize, iVar1 < iVar13; iVar1 = iVar1 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar1);
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vMap,iVar1);
    uVar10 = (ulong)((uint)pAVar8 & 1);
    (pAVar6->field_5).pData =
         (void *)((ulong)(((Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe))->field_5).pData ^
                 uVar10);
    pVVar4 = p_00->vFlopReprs;
    if (((pVVar4 != (Vec_Int_t *)0x0) && (iVar11 <= iVar1)) && (pAVar6 != pAVar8)) {
      iVar13 = Aig_ObjCioId(pAVar6);
      Vec_IntPush(pVVar4,iVar13);
      iVar13 = Aig_ObjIsConst1((Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe));
      if (iVar13 == 0) {
        if (uVar10 != 0) {
          pcVar3 = "!Aig_IsComplement(pObjMapped)";
          uVar2 = 0x56;
          goto LAB_0057feb8;
        }
        if ((*(uint *)&pAVar8->field_0x18 & 7) != 2) {
          pcVar3 = "Aig_ObjIsCi(pObjMapped)";
          uVar2 = 0x57;
          goto LAB_0057feb8;
        }
        iVar13 = Aig_ObjCioId(pAVar6);
        iVar12 = Aig_ObjCioId(pAVar8);
        if (iVar13 == iVar12) {
          pcVar3 = "Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped)";
          uVar2 = 0x58;
          goto LAB_0057feb8;
        }
        pVVar4 = p_00->vFlopReprs;
        iVar13 = Aig_ObjCioId(pAVar8);
      }
      else {
        pVVar4 = p_00->vFlopReprs;
        iVar13 = -1;
      }
      Vec_IntPush(pVVar4,iVar13);
    }
    p_01 = p->vCis;
  }
  if (p->vFlopReprs != (Vec_Int_t *)0x0) {
    for (iVar11 = p->nObjs[2] - p->nRegs; iVar11 < iVar13; iVar11 = iVar11 + 1) {
      puVar9 = (undefined8 *)Vec_PtrEntry(p_01,iVar11);
      *puVar9 = 0;
      p_01 = p->vCis;
      iVar13 = p_01->nSize;
    }
  }
  for (iVar11 = 0; iVar11 < p->vObjs->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar11);
    if (pAVar6 != (Aig_Obj_t *)0x0) {
      uVar2 = (uint)*(undefined8 *)&pAVar6->field_0x18;
      if ((uVar2 & 7) == 4) {
        pAVar8 = Aig_ObjChild0Copy(pAVar6);
      }
      else {
        if ((uVar2 & 7) - 7 < 0xfffffffe) goto LAB_0057fde9;
        pAVar8 = Aig_ObjChild0Copy(pAVar6);
        if (((ulong)pAVar6 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
        }
        uVar10 = (ulong)pAVar6->pFanin1 & 0xfffffffffffffffe;
        if (uVar10 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)((ulong)((uint)pAVar6->pFanin1 & 1) ^ *(ulong *)(uVar10 + 0x28));
        }
        pAVar8 = Aig_And(p_00,pAVar8,p1);
      }
      (pAVar6->field_5).pData = pAVar8;
    }
LAB_0057fde9:
  }
  for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar11);
    pAVar6 = Aig_ObjChild0Copy(pAVar6);
    Aig_ObjCreateCo(p_00,pAVar6);
  }
  if (p_00->nObjs[6] + p_00->nObjs[5] <= p->nObjs[6] + p->nObjs[5]) {
    Aig_ManSetRegNum(p_00,p->nRegs);
    iVar11 = Aig_ManCheck(p_00);
    if (iVar11 == 0) {
      puts("Aig_ManRemap(): The check has failed.");
    }
    return p_00;
  }
  pcVar3 = "Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew)";
  uVar2 = 0x6b;
LAB_0057feb8:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                ,uVar2,"Aig_Man_t *Aig_ManRemap(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Remaps the manager.]

  Description [Map in the array specifies for each CI node the node that
  should be used after remapping.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManRemap( Aig_Man_t * p, Vec_Ptr_t * vMap )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjMapped;
    int i, nTruePis;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    assert( p->vFlopNums == NULL || Vec_IntSize(p->vFlopNums) == p->nRegs );
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    if ( p->vFlopReprs )
        pNew->vFlopReprs = Vec_IntDup( p->vFlopReprs );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // implement the mapping
    nTruePis = Aig_ManCiNum(p)-Aig_ManRegNum(p);
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = (Aig_Obj_t *)(long)Vec_IntEntry( p->vFlopNums, i-nTruePis );
    }
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjMapped = (Aig_Obj_t *)Vec_PtrEntry( vMap, i );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pObjMapped)->pData, Aig_IsComplement(pObjMapped) );
        if ( pNew->vFlopReprs && i >= nTruePis && pObj != pObjMapped )
        {
            Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObj) );
            if ( Aig_ObjIsConst1( Aig_Regular(pObjMapped) ) )
                Vec_IntPush( pNew->vFlopReprs, -1 );
            else
            {
                assert( !Aig_IsComplement(pObjMapped) );
                assert( Aig_ObjIsCi(pObjMapped) );
                assert( Aig_ObjCioId(pObj) != Aig_ObjCioId(pObjMapped) );
                Vec_IntPush( pNew->vFlopReprs, Aig_ObjCioId(pObjMapped) );
            }
        }
    }
    if ( p->vFlopReprs )
    {
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pNext = NULL;
    }
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        else if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    assert( Aig_ManNodeNum(p) >= Aig_ManNodeNum(pNew) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManRemap(): The check has failed.\n" );
    return pNew;
}